

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
          (CThreadSynchronizationInfo *this)

{
  uint uVar1;
  _LIST_ENTRY *p_Var2;
  _LIST_ENTRY *p_Var3;
  PAL_ERROR PVar4;
  ulong uVar5;
  PAL_ERROR PVar6;
  ulong uVar7;
  _LIST_ENTRY *pvMem;
  
  if (this->m_lPendingSignalingCount < 0) {
    fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xfaa);
    fprintf(_stderr,"Expression: 0 <= m_lPendingSignalingCount\n");
  }
  uVar1 = this->m_lPendingSignalingCount;
  if ((int)uVar1 < 1) {
    PVar6 = 0;
  }
  else {
    uVar7 = 10;
    if ((int)uVar1 < 10) {
      uVar7 = (ulong)uVar1;
    }
    uVar5 = 0;
    PVar6 = 0;
    do {
      PVar4 = CPalSynchronizationManager::SignalThreadCondition
                        (&(this->m_rgpthrPendingSignalings[uVar5]->synchronizationInfo).
                          m_tnwdNativeData);
      if (PVar4 != 0) {
        PVar6 = PVar4;
      }
      CPalThread::ReleaseThreadReference(this->m_rgpthrPendingSignalings[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    if (10 < this->m_lPendingSignalingCount) {
      pvMem = (this->m_lePendingSignalingsOverflowList).Flink;
      while (pvMem != &this->m_lePendingSignalingsOverflowList) {
        p_Var2 = pvMem->Flink;
        p_Var3 = pvMem->Blink;
        p_Var3->Flink = p_Var2;
        p_Var2->Blink = p_Var3;
        PVar4 = CPalSynchronizationManager::SignalThreadCondition
                          ((ThreadNativeWaitData *)(pvMem[1].Flink + 0x1a));
        if (PVar4 != 0) {
          PVar6 = PVar4;
        }
        CPalThread::ReleaseThreadReference((CPalThread *)pvMem[1].Flink);
        InternalFree(pvMem);
        uVar5 = (ulong)((int)uVar5 + 1);
        pvMem = (this->m_lePendingSignalingsOverflowList).Flink;
      }
      if ((int)uVar5 != this->m_lPendingSignalingCount) {
        fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xfe3);
        fprintf(_stderr,"Expression: lIdx == m_lPendingSignalingCount\n");
      }
    }
    this->m_lPendingSignalingCount = 0;
  }
  return PVar6;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings()
    {
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(0 <= m_lPendingSignalingCount);

        if (0 < m_lPendingSignalingCount)
        {
            LONG lArrayPendingSignalingCount =
                min(PendingSignalingsArraySize, m_lPendingSignalingCount);
            LONG lIdx = 0;
            PAL_ERROR palTempErr;

            // Signal all the pending signalings from the array
            for (lIdx = 0; lIdx < lArrayPendingSignalingCount; lIdx++)
            {
                // Do the actual signaling
                palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                    m_rgpthrPendingSignalings[lIdx]->synchronizationInfo.GetNativeData());
                if (NO_ERROR != palTempErr)
                {
                    palErr = palTempErr;
                }

                // Release the thread reference
                m_rgpthrPendingSignalings[lIdx]->ReleaseThreadReference();
            }

            // Signal any pending signalings from the array overflow list
            if (m_lPendingSignalingCount > PendingSignalingsArraySize)
            {
                PLIST_ENTRY pLink;
                DeferredSignalingListNode * pdsln;

                while (!IsListEmpty(&m_lePendingSignalingsOverflowList))
                {
                    // Remove a node from the head of the queue
                    // Note: no need to synchronize the access to this list since
                    // it is meant to be accessed only by the owner thread.
                    pLink = RemoveHeadList(&m_lePendingSignalingsOverflowList);
                    pdsln = CONTAINING_RECORD(pLink,
                                              DeferredSignalingListNode,
                                              Link);

                    // Do the actual signaling
                    palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                        pdsln->pthrTarget->synchronizationInfo.GetNativeData());
                    if (NO_ERROR != palTempErr)
                    {
                        palErr = palTempErr;
                    }

                    // Release the thread reference
                    pdsln->pthrTarget->ReleaseThreadReference();

                    // Delete the node
                    InternalDelete(pdsln);

                    lIdx += 1;
                }

                _ASSERTE(lIdx == m_lPendingSignalingCount);
            }

            // Reset the counter of pending signalings for this thread
            m_lPendingSignalingCount = 0;
        }

        return palErr;
    }